

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int propagateConstantExprRewrite(Walker *pWalker,Expr *pExpr)

{
  uint uVar1;
  WhereConst *pWVar2;
  Expr **ppEVar3;
  Expr *pEVar4;
  int iVar5;
  long lVar6;
  
  iVar5 = 0;
  if ((pExpr->op == 0xa2) && (uVar1 = pExpr->flags, iVar5 = 0, (uVar1 & 8) == 0)) {
    pWVar2 = (pWalker->u).pConst;
    iVar5 = 1;
    if (0 < (long)pWVar2->nConst) {
      ppEVar3 = pWVar2->apExpr;
      lVar6 = 0;
      do {
        pEVar4 = *(Expr **)((long)ppEVar3 + lVar6);
        if (((pEVar4 != pExpr) && (pEVar4->iTable == pExpr->iTable)) &&
           (pEVar4->iColumn == pExpr->iColumn)) {
          pWVar2->nChng = pWVar2->nChng + 1;
          pExpr->flags = uVar1 & 0xff7ffff7 | 8;
          pEVar4 = *(Expr **)((long)ppEVar3 + lVar6 + 8);
          if (pEVar4 == (Expr *)0x0) {
            pEVar4 = (Expr *)0x0;
          }
          else {
            pEVar4 = exprDup(pWVar2->pParse->db,pEVar4,0,(u8 **)0x0);
          }
          pExpr->pLeft = pEVar4;
          return 1;
        }
        lVar6 = lVar6 + 0x10;
      } while ((long)pWVar2->nConst * 0x10 != lVar6);
    }
  }
  return iVar5;
}

Assistant:

static int propagateConstantExprRewrite(Walker *pWalker, Expr *pExpr){
  int i;
  WhereConst *pConst;
  if( pExpr->op!=TK_COLUMN ) return WRC_Continue;
  if( ExprHasProperty(pExpr, EP_FixedCol) ) return WRC_Continue;
  pConst = pWalker->u.pConst;
  for(i=0; i<pConst->nConst; i++){
    Expr *pColumn = pConst->apExpr[i*2];
    if( pColumn==pExpr ) continue;
    if( pColumn->iTable!=pExpr->iTable ) continue;
    if( pColumn->iColumn!=pExpr->iColumn ) continue;
    /* A match is found.  Add the EP_FixedCol property */
    pConst->nChng++;
    ExprClearProperty(pExpr, EP_Leaf);
    ExprSetProperty(pExpr, EP_FixedCol);
    assert( pExpr->pLeft==0 );
    pExpr->pLeft = sqlite3ExprDup(pConst->pParse->db, pConst->apExpr[i*2+1], 0);
    break;
  }
  return WRC_Prune;
}